

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_delete_back_door_file.cc
# Opt level: O2

int __thiscall
aliyun::Yundun::DeleteBackDoorFile
          (Yundun *this,YundunDeleteBackDoorFileRequestType *req,
          YundunDeleteBackDoorFileResponseType *response,YundunErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  AliRpcRequest *this_00;
  Value *pVVar3;
  char *pcVar4;
  allocator<char> local_394;
  allocator<char> local_393;
  allocator<char> local_392;
  allocator<char> local_391;
  string local_390;
  Value val;
  string str_response;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar4 = "http";
  if (this->use_tls_ != false) {
    pcVar4 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar4,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,this->version_,(allocator<char> *)&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,this->secret_,&local_394);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_178,&local_198,&local_1b8,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  if (((this->use_tls_ == false) && (pcVar4 = this->proxy_host_, pcVar4 != (char *)0x0)) &&
     (*pcVar4 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,pcVar4,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"Action",(allocator<char> *)&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"DeleteBackDoorFile",&local_394);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_218,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  if ((req->jst_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"JstOwnerId",(allocator<char> *)&local_390);
    std::__cxx11::string::string((string *)&local_278,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_258,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_258);
  }
  if ((req->instance_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"InstanceId",(allocator<char> *)&local_390);
    std::__cxx11::string::string((string *)&local_2b8,(string *)&req->instance_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_298,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_298);
  }
  if ((req->path)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"Path",(allocator<char> *)&local_390);
    std::__cxx11::string::string((string *)&local_2f8,(string *)&req->path);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2d8,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"RegionId",(allocator<char> *)&local_390);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,this->region_id_,&local_394);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_318,&local_338);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_318);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (YundunErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_390,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,anon_var_dwarf_12f544 + 9,&local_394);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_390);
        std::__cxx11::string::~string((string *)&local_390);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_390,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,anon_var_dwarf_12f544 + 9,&local_391);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_390);
        std::__cxx11::string::~string((string *)&local_390);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_390,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,anon_var_dwarf_12f544 + 9,&local_392);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_390);
        std::__cxx11::string::~string((string *)&local_390);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_390,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,anon_var_dwarf_12f544 + 9,&local_393);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_390);
        std::__cxx11::string::~string((string *)&local_390);
      }
      goto LAB_00135105;
    }
  }
  iVar2 = -1;
  if (error_info != (YundunErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00135105:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Yundun::DeleteBackDoorFile(const YundunDeleteBackDoorFileRequestType& req,
                      YundunDeleteBackDoorFileResponseType* response,
                       YundunErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DeleteBackDoorFile");
  if(!req.jst_owner_id.empty()) {
    req_rpc->AddRequestQuery("JstOwnerId", req.jst_owner_id);
  }
  if(!req.instance_id.empty()) {
    req_rpc->AddRequestQuery("InstanceId", req.instance_id);
  }
  if(!req.path.empty()) {
    req_rpc->AddRequestQuery("Path", req.path);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}